

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fASTCDecompressionCases.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::ASTCBlockSizeRemainderCase2D::iterate(ASTCBlockSizeRemainderCase2D *this)

{
  int *value;
  ostringstream *poVar1;
  TextureFormat log;
  RenderContext *context;
  ASTCRenderer2D *this_00;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  IterateResult IVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int height;
  IVec2 blockSize;
  int curRemainderY;
  int curRemainderX;
  ScopedLogSection section;
  RGBA threshold;
  Surface referenceFrame;
  Surface renderedFrame;
  string local_308;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  CompressedTexture compressed;
  Texture2D texture;
  undefined1 local_1b0 [384];
  
  log = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Vector<int,_2>::Vector
            (&blockSize,
             &((this->m_renderer).
               super_UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
               .m_data.ptr)->m_blockSize);
  curRemainderY = this->m_currentIteration / blockSize.m_data[0];
  curRemainderX = this->m_currentIteration % blockSize.m_data[0];
  iVar5 = curRemainderX + blockSize.m_data[0] * 4;
  iVar10 = iVar5 / blockSize.m_data[0];
  iVar7 = iVar5 % blockSize.m_data[0];
  height = curRemainderY + blockSize.m_data[1] * 4;
  iVar9 = height / blockSize.m_data[1];
  iVar8 = height % blockSize.m_data[1];
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar4 = (*context->_vptr_RenderContext[4])();
  local_1b0._0_4_ =
       tcu::PixelFormat::getColorThreshold((PixelFormat *)(CONCAT44(extraout_var,iVar4) + 8));
  bVar3 = tcu::isAstcSRGBFormat(this->m_format);
  texture._vptr_Texture2D._0_4_ = 0x1010101;
  if (bVar3) {
    texture._vptr_Texture2D._0_4_ = 0x2020202;
  }
  threshold = tcu::operator+((RGBA *)local_1b0,(RGBA *)&texture);
  tcu::CompressedTexture::CompressedTexture(&compressed,this->m_format,iVar5,height,1);
  tcu::astc::generateDummyNormalBlocks
            (compressed.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (long)(int)(((iVar9 + 1) - (uint)(iVar8 == 0)) * ((iVar10 + 1) - (uint)(iVar7 == 0))),
             blockSize.m_data[0],blockSize.m_data[1]);
  bVar3 = true;
  if (((this->m_renderer).
       super_UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
       .m_data.ptr)->m_astcSupport != ASTCSUPPORTLEVEL_LDR) {
    bVar3 = tcu::isAstcSRGBFormat(this->m_format);
  }
  tcu::Surface::Surface(&renderedFrame,iVar5,height);
  tcu::Surface::Surface(&referenceFrame,iVar5,height);
  uVar2 = local_1b0._0_8_;
  local_1b0._1_3_ = 0;
  local_1b0[0] = bVar3 ^ 1;
  local_1b0._4_4_ = SUB84(uVar2,4);
  IVar6 = CONTINUE;
  glu::Texture2D::Texture2D
            (&texture,context,((this->super_TestCase).m_context)->m_contextInfo,1,&compressed,
             (TexDecompressionParams *)local_1b0);
  this_00 = (this->m_renderer).
            super_UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
            .m_data.ptr;
  local_1b0._0_8_ = tcu::getUncompressedFormat(compressed.m_format);
  ASTCDecompressionCaseInternal::ASTCRenderer2D::render
            (this_00,&referenceFrame,&renderedFrame,&texture,(TextureFormat *)local_1b0);
  value = &this->m_currentIteration;
  de::toString<int>(&local_268,value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 "Iteration ",&local_268);
  de::toString<int>(&local_2e8,&curRemainderX);
  std::operator+(&local_2c8,"Remainder ",&local_2e8);
  std::operator+(&local_2a8,&local_2c8,"x");
  de::toString<int>(&local_308,&curRemainderY);
  std::operator+(&local_288,&local_2a8,&local_308);
  tcu::ScopedLogSection::ScopedLogSection(&section,(TestLog *)log,(string *)local_1b0,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)&local_268);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Using texture of size ");
  std::ostream::operator<<(poVar1,iVar5);
  std::operator<<((ostream *)poVar1,"x");
  std::ostream::operator<<(poVar1,height);
  std::operator<<((ostream *)poVar1," and block size ");
  std::ostream::operator<<(poVar1,blockSize.m_data[0]);
  std::operator<<((ostream *)poVar1,"x");
  std::ostream::operator<<(poVar1,blockSize.m_data[1]);
  std::operator<<((ostream *)poVar1,"; the x and y remainders are ");
  std::ostream::operator<<(poVar1,curRemainderX);
  std::operator<<((ostream *)poVar1," and ");
  std::ostream::operator<<(poVar1,curRemainderY);
  std::operator<<((ostream *)poVar1," respectively");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  bVar3 = tcu::pixelThresholdCompare
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     "ComparisonResult","Comparison Result",&referenceFrame,&renderedFrame,
                     &threshold,COMPARE_LOG_ON_ERROR - (this->m_currentIteration == 0));
  if (bVar3) {
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    iVar5 = *value;
    if ((iVar5 == 0) && (iVar5 = 0, 1 < blockSize.m_data[1] * blockSize.m_data[0])) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Note: not logging further images unless reference comparison fails");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      iVar5 = *value;
    }
    *value = iVar5 + 1;
    if (blockSize.m_data[1] * blockSize.m_data[0] <= iVar5 + 1) {
      IVar6 = STOP;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    IVar6 = STOP;
  }
  glu::Texture2D::~Texture2D(&texture);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  tcu::CompressedTexture::~CompressedTexture(&compressed);
  return IVar6;
}

Assistant:

ASTCBlockSizeRemainderCase2D::IterateResult ASTCBlockSizeRemainderCase2D::iterate (void)
{
	TestLog&						log						= m_testCtx.getLog();
	const IVec2						blockSize				= m_renderer->getBlockSize();
	const int						curRemainderX			= m_currentIteration % blockSize.x();
	const int						curRemainderY			= m_currentIteration / blockSize.x();
	const int						imageWidth				= (MAX_NUM_BLOCKS_X-1)*blockSize.x() + curRemainderX;
	const int						imageHeight				= (MAX_NUM_BLOCKS_Y-1)*blockSize.y() + curRemainderY;
	const int						numBlocksX				= deDivRoundUp32(imageWidth, blockSize.x());
	const int						numBlocksY				= deDivRoundUp32(imageHeight, blockSize.y());
	const int						totalNumBlocks			= numBlocksX * numBlocksY;
	const glu::RenderContext&		renderCtx				= m_context.getRenderContext();
	const tcu::RGBA					threshold				= renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + (tcu::isAstcSRGBFormat(m_format) ? tcu::RGBA(2,2,2,2) : tcu::RGBA(1,1,1,1));
	tcu::CompressedTexture			compressed				(m_format, imageWidth, imageHeight);

	DE_ASSERT(compressed.getDataSize() == totalNumBlocks*tcu::astc::BLOCK_SIZE_BYTES);
	tcu::astc::generateDummyNormalBlocks((deUint8*)compressed.getData(), totalNumBlocks, blockSize.x(), blockSize.y());

	// Create texture and render.

	const tcu::TexDecompressionParams::AstcMode	decompressionMode	= (m_renderer->getASTCSupport() == ASTCSUPPORTLEVEL_LDR || tcu::isAstcSRGBFormat(m_format))
																	? tcu::TexDecompressionParams::ASTCMODE_LDR
																	: tcu::TexDecompressionParams::ASTCMODE_HDR;
	Surface										renderedFrame		(imageWidth, imageHeight);
	Surface										referenceFrame		(imageWidth, imageHeight);
	glu::Texture2D								texture				(renderCtx, m_context.getContextInfo(), 1, &compressed, tcu::TexDecompressionParams(decompressionMode));

	m_renderer->render(referenceFrame, renderedFrame, texture, getUncompressedFormat(compressed.getFormat()));

	{
		// Compare and log.

		tcu::ScopedLogSection section(log, "Iteration " + de::toString(m_currentIteration),
										   "Remainder " + de::toString(curRemainderX) + "x" + de::toString(curRemainderY));

		log << TestLog::Message << "Using texture of size "
								<< imageWidth << "x" << imageHeight
								<< " and block size "
								<< blockSize.x() << "x" << blockSize.y()
								<< "; the x and y remainders are "
								<< curRemainderX << " and " << curRemainderY << " respectively"
			<< TestLog::EndMessage;

		const bool compareOk = tcu::pixelThresholdCompare(m_testCtx.getLog(), "ComparisonResult", "Comparison Result", referenceFrame, renderedFrame, threshold,
														  m_currentIteration == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

		if (!compareOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
			return STOP;
		}
	}

	if (m_currentIteration == 0 && m_currentIteration+1 < blockSize.x()*blockSize.y())
		log << TestLog::Message << "Note: not logging further images unless reference comparison fails" << TestLog::EndMessage;

	m_currentIteration++;

	if (m_currentIteration >= blockSize.x()*blockSize.y())
	{
		DE_ASSERT(m_currentIteration == blockSize.x()*blockSize.y());
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}
	return CONTINUE;
}